

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr term_init(term *t,wchar_t w,wchar_t h,wchar_t k)

{
  ui_event *puVar1;
  int *piVar2;
  term_win *ptVar3;
  wchar_t local_20;
  wchar_t y;
  wchar_t k_local;
  wchar_t h_local;
  wchar_t w_local;
  term *t_local;
  
  memset(t,0,0xd8);
  t->key_tail = 0;
  t->key_head = 0;
  t->key_size = (uint16_t)k;
  puVar1 = (ui_event *)mem_zalloc((ulong)t->key_size * 0xc);
  t->key_queue = puVar1;
  t->wid = w;
  t->hgt = h;
  piVar2 = (int *)mem_zalloc((long)h << 2);
  t->x1 = piVar2;
  piVar2 = (int *)mem_zalloc((long)h << 2);
  t->x2 = piVar2;
  ptVar3 = (term_win *)mem_zalloc(0x60);
  t->old = ptVar3;
  term_win_init(t->old,w,h);
  ptVar3 = (term_win *)mem_zalloc(0x60);
  t->scr = ptVar3;
  term_win_init(t->scr,w,h);
  for (local_20 = L'\0'; local_20 < h; local_20 = local_20 + L'\x01') {
    t->x1[local_20] = 0;
    t->x2[local_20] = w + L'\xffffffff';
  }
  t->y1 = 0;
  t->y2 = h + L'\xffffffff';
  t->total_erase = true;
  t->saved = '\0';
  t->sidebar_mode = 0;
  return 0;
}

Assistant:

errr term_init(term *t, int w, int h, int k)
{
	int y;

	/* Wipe it */
	memset(t, 0, sizeof(term));

	/* Prepare the input queue */
	t->key_head = t->key_tail = 0;

	/* Determine the input queue size */
	t->key_size = k;

	/* Allocate the input queue */
	t->key_queue = mem_zalloc(t->key_size * sizeof(ui_event));

	/* Save the size */
	t->wid = w;
	t->hgt = h;

	/* Allocate change arrays */
	t->x1 = mem_zalloc(h * sizeof(int));
	t->x2 = mem_zalloc(h * sizeof(int));


	/* Allocate "displayed" */
	t->old = mem_zalloc(sizeof(term_win));

	/* Initialize "displayed" */
	term_win_init(t->old, w, h);


	/* Allocate "requested" */
	t->scr = mem_zalloc(sizeof(term_win));

	/* Initialize "requested" */
	term_win_init(t->scr, w, h);

	/* Assume change */
	for (y = 0; y < h; y++) {
		/* Assume change */
		t->x1[y] = 0;
		t->x2[y] = w - 1;
	}

	/* Assume change */
	t->y1 = 0;
	t->y2 = h - 1;

	/* Force "total erase" */
	t->total_erase = true;

	/* No saves yet */
	t->saved = 0;

	t->sidebar_mode = SIDEBAR_LEFT;

	/* Success */
	return (0);
}